

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,UInt32 code_point)

{
  UInt32 UVar1;
  allocator local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  undefined1 local_59;
  undefined1 local_58 [3];
  char str [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_14;
  string *psStack_10;
  UInt32 code_point_local;
  
  local_14 = (uint)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 < 0x200000) {
    if (local_14 < 0x80) {
      local_5c = 0;
      local_5d = (byte)this;
    }
    else {
      if (local_14 < 0x800) {
        local_5b = 0;
        UVar1 = ChopLowBits(&local_14,6);
        local_5c = (byte)UVar1;
        local_5d = (byte)local_14 | 0xc0;
      }
      else if (local_14 < 0x10000) {
        local_5a = 0;
        UVar1 = ChopLowBits(&local_14,6);
        local_5b = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(&local_14,6);
        local_5c = (byte)UVar1;
        local_5d = (byte)local_14 | 0xe0;
      }
      else {
        local_59 = 0;
        UVar1 = ChopLowBits(&local_14,6);
        local_5a = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(&local_14,6);
        local_5b = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(&local_14,6);
        local_5c = (byte)UVar1;
        local_5d = (byte)local_14 | 0xf0;
      }
      local_5c = local_5c | 0x80;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&local_5d,&local_5e);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e);
  }
  else {
    String::FormatHexUInt32_abi_cxx11_
              ((string *)local_58,(String *)((ulong)this & 0xffffffff),code_point);
    std::operator+(&local_38,"(Invalid Unicode 0x",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(UInt32 code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexUInt32(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}